

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int collect_addr_uses(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  uint uVar1;
  MIR_insn_t pMVar2;
  bitmap_t bm;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bb_insn_t_conflict *ppbVar6;
  size_t sVar7;
  long *plVar8;
  bb_insn_t_conflict pbVar9;
  VARR_bb_insn_t *pVVar10;
  int local_34;
  
  pMVar2 = bb_insn->insn;
  if ((*(int *)&pMVar2->field_0x18 - 0x22U < 0xfffffffc) && (iVar4 = move_p(pMVar2), iVar4 == 0)) {
LAB_00161f92:
    __assert_fail("MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xb15,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
  }
  plVar8 = (long *)pMVar2->ops[0].data;
  if (plVar8 == (long *)0x0) {
    local_34 = 1;
  }
  else {
    local_34 = 1;
    do {
      pbVar9 = (bb_insn_t_conflict)*plVar8;
      pMVar2 = pbVar9->insn;
      if (pMVar2->ops[*(uint *)((long)plVar8 + 0x14)].field_0x8 == '\v') {
        if ((1 < *(uint *)((long)plVar8 + 0x14)) ||
           ((*(ulong *)&pMVar2->field_0x18 & 0xfffffffc) != 0)) {
          __assert_fail("move_code_p (se->use->insn->code) && se->use_op_num <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0xb18,"int collect_addr_uses(gen_ctx_t, bb_insn_t, VARR_bb_insn_t *)");
        }
        if (bb_mem_insns != (VARR_bb_insn_t *)0x0) {
          ppbVar6 = bb_mem_insns->varr;
          if (ppbVar6 == (bb_insn_t_conflict *)0x0) {
            collect_addr_uses_cold_3();
LAB_00161f88:
            collect_addr_uses_cold_2();
LAB_00161f8d:
            collect_addr_uses_cold_1();
            goto LAB_00161f92;
          }
          uVar5 = bb_mem_insns->els_num + 1;
          pVVar10 = bb_mem_insns;
          if (bb_mem_insns->size < uVar5) {
LAB_00161e94:
            sVar7 = (uVar5 >> 1) + uVar5;
            ppbVar6 = (bb_insn_t_conflict *)realloc(ppbVar6,sVar7 * 8);
            pVVar10->varr = ppbVar6;
            pVVar10->size = sVar7;
          }
LAB_00161eb2:
          sVar7 = pVVar10->els_num;
          pVVar10->els_num = sVar7 + 1;
          pVVar10->varr[sVar7] = pbVar9;
        }
      }
      else {
        iVar4 = move_p(pMVar2);
        if (iVar4 == 0) {
          local_34 = 0;
        }
        else {
          bm = gen_ctx->temp_bitmap2;
          uVar1 = pbVar9->index;
          uVar5 = (ulong)uVar1;
          bitmap_expand(bm,uVar5 + 1);
          if (bm == (bitmap_t)0x0) goto LAB_00161f88;
          uVar1 = uVar1 >> 6;
          uVar3 = bm->varr[uVar1];
          bm->varr[uVar1] = uVar3 | 1L << (uVar5 & 0x3f);
          if ((uVar3 >> (uVar5 & 0x3f) & 1) == 0) {
            pVVar10 = gen_ctx->temp_bb_insns2;
            ppbVar6 = pVVar10->varr;
            if (ppbVar6 != (bb_insn_t_conflict *)0x0) {
              uVar5 = pVVar10->els_num + 1;
              pbVar9 = (bb_insn_t_conflict)*plVar8;
              if (pVVar10->size < uVar5) goto LAB_00161e94;
              goto LAB_00161eb2;
            }
            goto LAB_00161f8d;
          }
        }
      }
      plVar8 = (long *)plVar8[4];
    } while (plVar8 != (long *)0x0);
  }
  return local_34;
}

Assistant:

static int collect_addr_uses (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  gen_assert (MIR_addr_code_p (bb_insn->insn->code) || move_p (bb_insn->insn));
  for (ssa_edge_t se = bb_insn->insn->ops[0].data; se != NULL; se = se->next_use) {
    if (se->use->insn->ops[se->use_op_num].mode == MIR_OP_VAR_MEM) {
      gen_assert (move_code_p (se->use->insn->code) && se->use_op_num <= 1);
      if (bb_mem_insns != NULL) VARR_PUSH (bb_insn_t, bb_mem_insns, se->use);
      continue;
    }
    if (!move_p (se->use->insn)) {
      res = FALSE;
    } else if (bitmap_set_bit_p (temp_bitmap2, se->use->index)) {
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->use);
    }
  }
  return res;
}